

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_io.cc
# Opt level: O2

Ptr __thiscall core::image::load_ppm_16_file(image *this,string *filename)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Ptr PVar1;
  image local_28 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_20;
  
  load_ppm_file_intern(local_28,filename,false);
  std::dynamic_pointer_cast<core::Image<unsigned_short>,core::ImageBase>
            ((shared_ptr<core::ImageBase> *)this);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20);
  PVar1.super___shared_ptr<core::Image<unsigned_short>,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  PVar1.super___shared_ptr<core::Image<unsigned_short>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (Ptr)PVar1.super___shared_ptr<core::Image<unsigned_short>,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

RawImage::Ptr
load_ppm_16_file (std::string const& filename)
{
    return std::dynamic_pointer_cast<RawImage>
        (load_ppm_file_intern(filename, false));
}